

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void dumpVarint(DumpState *D,size_t x)

{
  uint local_28;
  byte local_22 [2];
  uint n;
  byte abStack_1c [2];
  lu_byte buff [10];
  size_t x_local;
  DumpState *D_local;
  
  local_28 = 1;
  buff[1] = (byte)x & 0x7f;
  buff._2_8_ = x;
  while (buff._2_8_ = (ulong)buff._2_8_ >> 7, buff._2_8_ != 0) {
    local_28 = local_28 + 1;
    local_22[10 - local_28] = (byte)buff._2_8_ & 0x7f | 0x80;
  }
  dumpBlock(D,buff + (2 - (ulong)local_28),(ulong)local_28);
  return;
}

Assistant:

static void dumpVarint (DumpState *D, size_t x) {
  lu_byte buff[DIBS];
  unsigned n = 1;
  buff[DIBS - 1] = x & 0x7f;  /* fill least-significant byte */
  while ((x >>= 7) != 0)  /* fill other bytes in reverse order */
    buff[DIBS - (++n)] = cast_byte((x & 0x7f) | 0x80);
  dumpVector(D, buff + DIBS - n, n);
}